

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O1

void __thiscall UrlParserTest::email_url::test_method(email_url *this)

{
  int iVar1;
  undefined1 local_280 [8];
  UrlParser parser;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char **local_f0;
  char *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  string **local_c8;
  char *local_c0;
  char *local_b8;
  shared_count sStack_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  char *local_90;
  string local_88;
  string local_68;
  string *local_48;
  char *local_40;
  undefined1 local_31;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"mailto:username@example.com","");
  httpparser::UrlParser::UrlParser((UrlParser *)local_280,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  parser.url._256_8_ = anon_var_dwarf_7266;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&parser.url.integerPort,0x76);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_f0 = &local_40;
  local_40 = (char *)CONCAT71(local_40._1_7_,local_280[0]);
  local_48 = (string *)&local_31;
  local_31 = 1;
  local_88._M_dataplus._M_p._0_1_ = local_280[0];
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_b8 = "";
  local_68.field_2._8_8_ = &local_f0;
  local_68._M_string_length._0_1_ = 0;
  local_68._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179a0;
  local_68.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_48;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_001179a0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_88.field_2._M_allocated_capacity);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_148 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x77);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  httpparser::UrlParser::scheme_abi_cxx11_(&local_88,(UrlParser *)local_280);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  local_c0 = (char *)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = (char *)0x0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (char **)0x113056;
  local_e8 = "";
  local_68._M_string_length._0_1_ = 0;
  local_68._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_68.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_68.field_2._8_8_ = &local_48;
  local_40 = "mailto";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00117c20;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = (string **)&local_40;
  local_48 = &local_88;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_a8,&local_f0,0x77,1,2,2,"parser.scheme()",&local_68,"\"mailto\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&sStack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
      &local_88.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                    local_88.field_2._M_allocated_capacity + 1);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_128 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x78);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  httpparser::UrlParser::username_abi_cxx11_(&local_88,(UrlParser *)local_280);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  local_c0 = (char *)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = (char *)0x0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (char **)0x113056;
  local_e8 = "";
  local_68._M_string_length._0_1_ = 0;
  local_68._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_68.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_68.field_2._8_8_ = &local_48;
  local_40 = "username";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00117b20;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = (string **)&local_40;
  local_48 = &local_88;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_a8,&local_f0,0x78,1,2,2,"parser.username()",&local_68,"\"username\"",
             &local_e0);
  boost::detail::shared_count::~shared_count(&sStack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
      &local_88.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                    local_88.field_2._M_allocated_capacity + 1);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_108 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x79);
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_00117928;
  local_98 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  httpparser::UrlParser::hostname_abi_cxx11_(&local_88,(UrlParser *)local_280);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  local_c0 = (char *)CONCAT71(local_c0._1_7_,iVar1 == 0);
  local_b8 = (char *)0x0;
  sStack_b0.pi_ = (sp_counted_base *)0x0;
  local_f0 = (char **)0x113056;
  local_e8 = "";
  local_68._M_string_length._0_1_ = 0;
  local_68._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001179e0;
  local_68.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_68.field_2._8_8_ = &local_48;
  local_40 = "example.com";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00117aa0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = (string **)&local_40;
  local_48 = &local_88;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_a8,&local_f0,0x79,1,2,2,"parser.hostname()",&local_68,
             "\"example.com\"",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
      &local_88.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                    local_88.field_2._M_allocated_capacity + 1);
  }
  httpparser::UrlParser::Url::~Url((Url *)&parser);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(email_url)
{
    const char *text = "mailto:username@example.com";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "mailto");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.hostname(), "example.com");
}